

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool nite::mousePressed(uint Button)

{
  uint uVar1;
  bool local_9;
  uint Button_local;
  
  uVar1 = Button - 0xc9;
  if (uVar1 < 4) {
    if ((isbuttonStatePressed[uVar1] & 1U) == 0) {
      if (((buttonStatePressed[uVar1] & 1U) == 0) || ((buttonState[uVar1] & 1U) == 0)) {
        if ((buttonStatePressed[uVar1] & 1U) == 0) {
          if (((buttonStatePressed[uVar1] & 1U) == 0) && ((buttonState[uVar1] & 1U) != 0)) {
            isbuttonStatePressed[uVar1] = true;
            buttonStatePressed[uVar1] = true;
            local_9 = true;
          }
          else {
            local_9 = false;
          }
        }
        else {
          buttonStatePressed[uVar1] = false;
          local_9 = false;
        }
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool nite::mousePressed(unsigned Button){
	Button -= 201;
	if (Button >= niteButtonsn){
		return 0;
	}

	if (isbuttonStatePressed[Button]){
		return 1;
	}

	if (buttonStatePressed[Button] and buttonState[Button]){
		return 0;
	}

	if (buttonStatePressed[Button]){
		buttonStatePressed[Button] = 0;
		return 0;
	}

	if (!buttonStatePressed[Button] and buttonState[Button]){
		isbuttonStatePressed[Button] = 1;
		buttonStatePressed[Button] = 1;
		return 1;
	}

	return 0;
}